

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFE.cpp
# Opt level: O3

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::HFE::get_track_at_position(HFE *this,Address address)

{
  FileHolder *this_00;
  HFE *pHVar1;
  uint16_t uVar2;
  int iVar3;
  pthread_mutex_t *__mutex;
  byte bVar4;
  size_t in_RCX;
  Address in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  int iVar6;
  void *pvVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  void *__buf;
  uint uVar11;
  shared_ptr<Storage::Disk::Track> sVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> section;
  undefined1 local_b9;
  undefined1 local_b8 [48];
  vector<bool,_std::allocator<bool>_> local_88;
  void *pvStack_60;
  undefined4 local_58;
  __blkcnt_t local_50;
  undefined4 local_48;
  long local_40;
  HFE *local_38;
  
  local_b8._40_8_ = 0x100000001;
  local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_50 = 0;
  local_48 = 0;
  local_40 = 0;
  local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  pvStack_60 = (void *)0x0;
  local_58 = 0;
  this_00 = (FileHolder *)((long)address + 8);
  __mutex = (pthread_mutex_t *)FileHolder::get_file_access_mutex(this_00);
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 == 0) {
    local_b8._32_8_ = __mutex;
    local_38 = this;
    uVar2 = seek_track((HFE *)address,in_RDX);
    std::vector<bool,_std::allocator<bool>_>::resize(&local_88,(ulong)((uint)uVar2 * 8),false);
    if (uVar2 != 0) {
      uVar11 = 0;
      do {
        iVar3 = uVar2 - uVar11;
        if (0xff < iVar3) {
          iVar3 = 0x100;
        }
        __buf = (void *)(ulong)(ushort)iVar3;
        FileHolder::read((FileHolder *)local_b8,(int)this_00,__buf,in_RCX);
        if (__buf != (void *)0x0) {
          iVar6 = uVar11 * 8;
          pvVar7 = (void *)0x0;
          do {
            bVar4 = (byte)iVar6 & 0x38;
            uVar8 = uVar11 + (int)pvVar7 >> 3;
            if ((*(byte *)((long)&((Track *)local_b8._0_8_)->_vptr_Track + (long)pvVar7) & 1) == 0)
            {
              uVar9 = ~(1L << bVar4) &
                      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar8];
            }
            else {
              uVar9 = 1L << bVar4 |
                      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar8];
            }
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar8] = uVar9;
            uVar10 = 2L << bVar4 | uVar9;
            if ((*(byte *)((long)&((Track *)local_b8._0_8_)->_vptr_Track + (long)pvVar7) & 2) == 0)
            {
              uVar10 = ~(2L << bVar4) & uVar9;
            }
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar8] = uVar10;
            uVar9 = 4L << bVar4 | uVar10;
            if ((*(byte *)((long)&((Track *)local_b8._0_8_)->_vptr_Track + (long)pvVar7) & 4) == 0)
            {
              uVar9 = ~(4L << bVar4) & uVar10;
            }
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar8] = uVar9;
            uVar10 = 8L << bVar4 | uVar9;
            if ((*(byte *)((long)&((Track *)local_b8._0_8_)->_vptr_Track + (long)pvVar7) & 8) == 0)
            {
              uVar10 = ~(8L << bVar4) & uVar9;
            }
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar8] = uVar10;
            uVar9 = 0x10L << bVar4 | uVar10;
            if ((*(byte *)((long)&((Track *)local_b8._0_8_)->_vptr_Track + (long)pvVar7) & 0x10) ==
                0) {
              uVar9 = ~(0x10L << bVar4) & uVar10;
            }
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar8] = uVar9;
            uVar10 = 0x20L << bVar4 | uVar9;
            if ((*(byte *)((long)&((Track *)local_b8._0_8_)->_vptr_Track + (long)pvVar7) & 0x20) ==
                0) {
              uVar10 = ~(0x20L << bVar4) & uVar9;
            }
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar8] = uVar10;
            uVar9 = 0x40L << bVar4 | uVar10;
            if ((*(byte *)((long)&((Track *)local_b8._0_8_)->_vptr_Track + (long)pvVar7) & 0x40) ==
                0) {
              uVar9 = ~(0x40L << bVar4) & uVar10;
            }
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar8] = uVar9;
            in_RCX = ~(0x80L << bVar4) & uVar9;
            uVar9 = 0x80L << bVar4 | uVar9;
            if (-1 < *(char *)((long)&((Track *)local_b8._0_8_)->_vptr_Track + (long)pvVar7)) {
              uVar9 = in_RCX;
            }
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar8] = uVar9;
            pvVar7 = (void *)((long)pvVar7 + 1);
            iVar6 = iVar6 + 8;
          } while (__buf != pvVar7);
        }
        FileHolder::seek(this_00,0x100,1);
        if ((PCMTrack *)local_b8._0_8_ != (PCMTrack *)0x0) {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
        }
        uVar11 = iVar3 + uVar11 & 0xffff;
      } while (uVar11 < uVar2);
    }
    pthread_mutex_unlock((pthread_mutex_t *)local_b8._32_8_);
    local_b8._0_8_ = (PCMTrack *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Disk::PCMTrack,std::allocator<Storage::Disk::PCMTrack>,Storage::Disk::PCMSegment&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8),(PCMTrack **)local_b8,
               (allocator<Storage::Disk::PCMTrack> *)&local_b9,(PCMSegment *)(local_b8 + 0x28));
    pHVar1 = local_38;
    (local_38->super_DiskImage)._vptr_DiskImage = (_func_int **)local_b8._0_8_;
    (local_38->file_).file_ = (FILE *)local_b8._8_8_;
    _Var5._M_pi = extraout_RDX;
    if (pvStack_60 != (void *)0x0) {
      operator_delete(pvStack_60,local_40 - (long)pvStack_60);
      pvStack_60 = (void *)0x0;
      local_58 = 0;
      local_50 = 0;
      local_48 = 0;
      local_40 = 0;
      _Var5._M_pi = extraout_RDX_00;
    }
    if (local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      _Var5._M_pi = extraout_RDX_01;
    }
    sVar12.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var5._M_pi;
    sVar12.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pHVar1;
    return (shared_ptr<Storage::Disk::Track>)
           sVar12.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

std::shared_ptr<Track> HFE::get_track_at_position(Track::Address address) {
	PCMSegment segment;
	{
		std::lock_guard lock_guard(file_.get_file_access_mutex());
		uint16_t track_length = seek_track(address);

		segment.data.resize(track_length * 8);

		// HFE tracks are stored as 256 bytes for side 1, then 256 bytes for side 2,
		// then 256 bytes for side 1, then 256 bytes for side 2, etc, until the final
		// 512-byte segment which will contain less than the full 256 bytes.
		//
		// seek_track will have advanced an extra initial 256 bytes if the address
		// refers to side 2, so the loop below can act ass though it were definitely
		// dealing with side 1.
		uint16_t c = 0;
		while(c < track_length) {
			// Decide how many bytes of at most 256 to read, and read them.
			uint16_t length = uint16_t(std::min(256, track_length - c));
			std::vector<uint8_t> section = file_.read(length);

			// Push those into the PCMSegment. In HFE the least-significant bit is
			// serialised first. TODO: move this logic to PCMSegment.
			for(uint16_t byte = 0; byte < length; ++byte) {
				const size_t base = size_t(c + byte) << 3;
				segment.data[base + 0] = !!(section[byte] & 0x01);
				segment.data[base + 1] = !!(section[byte] & 0x02);
				segment.data[base + 2] = !!(section[byte] & 0x04);
				segment.data[base + 3] = !!(section[byte] & 0x08);
				segment.data[base + 4] = !!(section[byte] & 0x10);
				segment.data[base + 5] = !!(section[byte] & 0x20);
				segment.data[base + 6] = !!(section[byte] & 0x40);
				segment.data[base + 7] = !!(section[byte] & 0x80);
			}

			// Advance the target pointer, and skip the next 256 bytes of the file
			// (which will be for the other side of the disk).
			c += length;
			file_.seek(256, SEEK_CUR);
		}
	}

	return std::make_shared<PCMTrack>(segment);
}